

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.h
# Opt level: O3

RWNode * __thiscall
dg::dda::MemorySSATransformation::SubgraphInfo::Summary::getUnknownPhi(Summary *this)

{
  RWNode *pRVar1;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> S;
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  local_50;
  DefSite local_20;
  
  local_20.target = (RWNode *)UNKNOWN_MEMORY;
  local_20.offset.offset = 0;
  local_20.len.offset = Offset::UNKNOWN;
  DefinitionsMap<dg::dda::RWNode>::get
            ((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)&local_50,&this->inputs,&local_20);
  if (local_50._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pRVar1 = (RWNode *)0x0;
  }
  else {
    pRVar1 = *(RWNode **)(local_50._M_impl.super__Rb_tree_header._M_header._M_left + 1);
  }
  std::
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  ::_M_erase(&local_50,(_Link_type)local_50._M_impl.super__Rb_tree_header._M_header._M_parent);
  return pRVar1;
}

Assistant:

RWNode *getUnknownPhi() {
                // FIXME: optimize this, we create std::set for nothing...
                auto S = inputs.get({UNKNOWN_MEMORY, 0, Offset::UNKNOWN});
                if (S.empty()) {
                    return nullptr;
                }
                assert(S.size() == 1);
                return *(S.begin());
            }